

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O1

uint32_t __thiscall FpgaIO::PromGetId(FpgaIO *this)

{
  BasePort *pBVar1;
  int iVar2;
  uint32_t id;
  uint32_t local_c;
  
  local_c = 0;
  pBVar1 = (this->super_BoardIO).port;
  iVar2 = (*pBVar1->_vptr_BasePort[0x24])(pBVar1,(ulong)(this->super_BoardIO).BoardId,8,0x9f000000);
  if ((char)iVar2 != '\0') {
    (*((this->super_BoardIO).port)->_vptr_BasePort[0x2c])();
    PromGetResult(this,&local_c,PROM_M25P16);
  }
  return local_c;
}

Assistant:

uint32_t FpgaIO::PromGetId(void)
{
    uint32_t id = 0;
    quadlet_t data = 0x9f000000;
    if (port->WriteQuadlet(BoardId, 0x08, data)) {
        port->PromDelay();
        // Should be ready by now...
        PromGetResult(id);
    }
    return id;
}